

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastCharAt
          (Lowerer *this,BuiltinFunction index,Opnd *dst,Opnd *srcStr,Opnd *srcIndex,
          Instr *callInstr,Instr *insertInstr,LabelInstr *labelHelper,LabelInstr *doneLabel)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int32 iVar4;
  uint32 uVar5;
  Lowerer *pLVar6;
  RegOpnd *pRVar7;
  PragmaInstr *instr;
  AddrOpnd *pAVar8;
  RegOpnd *baseOpnd;
  RegOpnd *baseOpnd_00;
  IndirOpnd *pIVar9;
  IntConstOpnd *pIVar10;
  Opnd *pOVar11;
  Lowerer *pLVar12;
  undefined4 *puVar13;
  RegOpnd *local_40;
  IndirOpnd *local_38;
  
  pLVar6 = (Lowerer *)srcStr;
  bVar3 = IR::Opnd::IsRegOpnd(srcStr);
  if (bVar3) {
    pLVar6 = (Lowerer *)IR::Opnd::AsRegOpnd(srcStr);
    bVar3 = IR::Opnd::IsTaggedInt((Opnd *)pLVar6);
    if (bVar3) {
      bVar2 = true;
      bVar3 = false;
      goto LAB_00575813;
    }
    pLVar6 = (Lowerer *)IR::Opnd::AsRegOpnd(srcStr);
    bVar3 = IR::Opnd::IsNotTaggedValue((Opnd *)pLVar6);
  }
  else {
    bVar3 = false;
  }
  bVar2 = false;
LAB_00575813:
  pRVar7 = GetRegOpnd(pLVar6,srcStr,insertInstr,this->m_func,TyVar);
  if (bVar3 == false) {
    if (bVar2) {
      instr = IR::PragmaInstr::New(DeletedNonHelperBranch,0,this->m_func);
      IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
      InsertBranch(Br,labelHelper,insertInstr);
    }
    else {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar7->super_Opnd,insertInstr,labelHelper,false);
    }
  }
  bVar3 = IR::Opnd::IsAddrOpnd(srcIndex);
  if (bVar3) {
    pAVar8 = IR::Opnd::AsAddrOpnd(srcIndex);
    iVar4 = Js::TaggedInt::ToInt32(pAVar8->m_address);
    if (iVar4 < 0) {
      labelHelper->field_0x78 = labelHelper->field_0x78 & 0xfd;
      InsertBranch(Br,labelHelper,insertInstr);
      return false;
    }
  }
  GenerateStringTest(this,pRVar7,insertInstr,labelHelper,(LabelInstr *)0x0,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  baseOpnd_00 = IR::Opnd::AsRegOpnd(&pRVar7->super_Opnd);
  pIVar9 = IR::IndirOpnd::New(baseOpnd_00,0x10,TyUint64,this->m_func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar9->super_Opnd,insertInstr,true);
  InsertTestBranch(&baseOpnd->super_Opnd,&baseOpnd->super_Opnd,BrEq_A,labelHelper,insertInstr);
  local_40 = IR::RegOpnd::New(TyUint32,this->m_func);
  pIVar9 = IR::IndirOpnd::New(pRVar7,0x18,TyUint32,this->m_func,false);
  InsertMove(&local_40->super_Opnd,&pIVar9->super_Opnd,insertInstr,true);
  bVar3 = IR::Opnd::IsAddrOpnd(srcIndex);
  if (bVar3) {
    pAVar8 = IR::Opnd::AsAddrOpnd(srcIndex);
    uVar5 = Js::TaggedInt::ToUInt32(pAVar8->m_address);
    pLVar12 = (Lowerer *)(ulong)uVar5;
    pLVar6 = pLVar12;
    pIVar10 = IR::IntConstOpnd::New((IntConstType)pLVar12,TyUint32,this->m_func,false);
    InsertCompareBranch(pLVar6,&local_40->super_Opnd,&pIVar10->super_Opnd,BrLe_A,true,labelHelper,
                        insertInstr,false);
    local_38 = IR::IndirOpnd::New(baseOpnd,uVar5 * 2,TyUint16,this->m_func,false);
    pIVar10 = IR::IntConstOpnd::New((IntConstType)pLVar12,TyUint64,this->m_func,false);
  }
  else {
    pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
    InsertMove(&pRVar7->super_Opnd,srcIndex,insertInstr,true);
    pLVar6 = this;
    pIVar10 = (IntConstOpnd *)GenerateUntagVar(this,pRVar7,labelHelper,insertInstr,true);
    InsertCompareBranch(pLVar6,&local_40->super_Opnd,(Opnd *)pIVar10,BrLe_A,true,labelHelper,
                        insertInstr,false);
    if (TySize[(pIVar10->super_Opnd).m_type] != 8) {
      pOVar11 = IR::Opnd::UseWithNewType((Opnd *)pIVar10,TyUint64,this->m_func);
      pIVar10 = (IntConstOpnd *)IR::Opnd::AsRegOpnd(pOVar11);
    }
    local_38 = IR::IndirOpnd::New(baseOpnd,(RegOpnd *)pIVar10,'\x01',TyUint16,this->m_func);
  }
  if (DAT_01441ddf == '\x01') {
    pRVar7 = IR::RegOpnd::New(TyUint64,this->m_func);
    if (TySize[(local_40->super_Opnd).m_type] != 8) {
      pOVar11 = IR::Opnd::UseWithNewType(&local_40->super_Opnd,TyUint64,this->m_func);
      local_40 = IR::Opnd::AsRegOpnd(pOVar11);
    }
    InsertSub(false,&pRVar7->super_Opnd,&pIVar10->super_Opnd,&local_40->super_Opnd,insertInstr);
    pIVar10 = IR::IntConstOpnd::New(0x3f,TyInt8,this->m_func,false);
    InsertShift(Shr_A,false,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pIVar10->super_Opnd,insertInstr
               );
    if (TySize[(pRVar7->super_Opnd).m_type] != 7) {
      pOVar11 = IR::Opnd::UseWithNewType(&pRVar7->super_Opnd,TyUint32,this->m_func);
      pRVar7 = IR::Opnd::AsRegOpnd(pOVar11);
    }
  }
  else {
    pRVar7 = (RegOpnd *)0x0;
  }
  pLVar12 = (Lowerer *)IR::RegOpnd::New(TyUint32,this->m_func);
  pLVar6 = pLVar12;
  InsertMove((Opnd *)pLVar12,&local_38->super_Opnd,insertInstr,true);
  if (DAT_01441ddf == '\x01') {
    pLVar6 = pLVar12;
    InsertAnd((Opnd *)pLVar12,(Opnd *)pLVar12,&pRVar7->super_Opnd,insertInstr);
  }
  if (index._value == '\a') {
    GenerateFastInlineStringCodePointAt
              (pLVar6,insertInstr,this->m_func,&local_40->super_Opnd,srcIndex,(RegOpnd *)pLVar12,
               baseOpnd);
  }
  else if (index._value != '\t') {
    if (index._value == '\b') {
      bVar3 = IR::Opnd::IsEqual(dst,srcStr);
      if (bVar3) {
        dst = &IR::RegOpnd::New(TyVar,this->m_func)->super_Opnd;
      }
      GenerateGetSingleCharString
                (this,(RegOpnd *)pLVar12,dst,labelHelper,doneLabel,insertInstr,false);
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5476,
                       "(index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt)"
                       ,
                       "index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar13 = 0;
  }
  if (TySize[*(byte *)((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                       &(pLVar12->m_lowererMD).FloatPrefThreshold + 1)] != 8) {
    pOVar11 = IR::Opnd::UseWithNewType((Opnd *)pLVar12,TyUint64,this->m_func);
    pLVar12 = (Lowerer *)IR::Opnd::AsRegOpnd(pOVar11);
  }
  LowererMD::GenerateInt32ToVarConversion(&this->m_lowererMD,(Opnd *)pLVar12,insertInstr);
  InsertMove(dst,(Opnd *)pLVar12,insertInstr,true);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastCharAt(Js::BuiltinFunction index, IR::Opnd *dst, IR::Opnd *srcStr, IR::Opnd *srcIndex, IR::Instr *callInstr,
    IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel)
{
    //  if regSrcStr is not object, JMP $helper
    //  CMP [regSrcStr + offset(type)] , static string type   -- check base string type
    //  JNE $helper
    //  MOV r1, [regSrcStr + offset(m_pszValue)]
    //  TEST r1, r1
    //  JEQ $helper
    //  MOV r2, srcIndex
    //  If r2 is not int, JMP $helper
    //  Convert r2 to int
    //  CMP [regSrcStr + offsetof(length)], r2
    //  JBE $helper
    //  MOVZX r2, [r1 + r2 * 2]
    //  if (charAt)
    //      PUSH r1
    //      PUSH scriptContext
    //      CALL GetStringFromChar
    //      MOV dst, EAX
    //  else (charCodeAt)
    //      if (codePointAt)
    //          Lowerer.GenerateFastCodePointAt -- Common inline functions
    //      Convert r2 to Var
    //      MOV dst, r2
    bool isInt = false;
    bool isNotTaggedValue = false;

    if (srcStr->IsRegOpnd())
    {
        if (srcStr->AsRegOpnd()->IsTaggedInt())
        {
            isInt = true;

        }
        else if (srcStr->AsRegOpnd()->IsNotTaggedValue())
        {
            isNotTaggedValue = true;
        }
    }

    IR::RegOpnd *regSrcStr = GetRegOpnd(srcStr, insertInstr, m_func, TyVar);

    if (!isNotTaggedValue)
    {
        if (!isInt)
        {
            m_lowererMD.GenerateObjectTest(regSrcStr, insertInstr, labelHelper);
        }
        else
        {
            // Insert delete branch opcode to tell the dbChecks not to assert on this helper label
            IR::Instr *fakeBr = IR::PragmaInstr::New(Js::OpCode::DeletedNonHelperBranch, 0, this->m_func);
            insertInstr->InsertBefore(fakeBr);

            InsertBranch(Js::OpCode::Br, labelHelper, insertInstr);
        }
    }

    // Bail out if index a constant and is less than zero.
    if (srcIndex->IsAddrOpnd() && Js::TaggedInt::ToInt32(srcIndex->AsAddrOpnd()->m_address) < 0)
    {
        labelHelper->isOpHelper = false;
        InsertBranch(Js::OpCode::Br, labelHelper, insertInstr);
        return false;
    }

    GenerateStringTest(regSrcStr, insertInstr, labelHelper, nullptr, false);

    // r1 contains the value of the char16* pointer inside JavascriptString.
    // MOV r1, [regSrcStr + offset(m_pszValue)]
    IR::RegOpnd *r1 = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(regSrcStr->AsRegOpnd(), Js::JavascriptString::GetOffsetOfpszValue(), TyMachPtr, this->m_func);
    InsertMove(r1, indirOpnd, insertInstr);

    // TEST r1, r1 -- Null pointer test
    // JEQ $helper
    InsertTestBranch(r1, r1, Js::OpCode::BrEq_A, labelHelper, insertInstr);

    IR::RegOpnd *strLength = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(strLength, IR::IndirOpnd::New(regSrcStr, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func), insertInstr);
    IR::Opnd* indexOpnd = nullptr;
    if (srcIndex->IsAddrOpnd())
    {
        uint32 indexValue = Js::TaggedInt::ToUInt32(srcIndex->AsAddrOpnd()->m_address);
        // CMP [regSrcStr + offsetof(length)], index
        // Use unsigned compare, this should handle negative indexes as well (they become > INT_MAX)
        // JBE $helper
        InsertCompareBranch(strLength, IR::IntConstOpnd::New(indexValue, TyUint32, m_func), Js::OpCode::BrLe_A, true, labelHelper, insertInstr);

        // Mask off the sign so that poisoning will work for negative indices
#if TARGET_32
        uint32 maskedIndex = CONFIG_FLAG_RELEASE(PoisonStringLoad) ? (indexValue & INT32_MAX) : indexValue;
#else
        uint32 maskedIndex = indexValue;
#endif
        indirOpnd = IR::IndirOpnd::New(r1, maskedIndex * sizeof(char16), TyUint16, this->m_func);
        indexOpnd = IR::IntConstOpnd::New(maskedIndex, TyMachPtr, m_func);
    }
    else
    {
        IR::RegOpnd *r2 = IR::RegOpnd::New(TyVar, this->m_func);
        // MOV r2, srcIndex
        InsertMove(r2, srcIndex, insertInstr);

        r2 = GenerateUntagVar(r2, labelHelper, insertInstr);

        // CMP [regSrcStr + offsetof(length)], r2
        // Use unsigned compare, this should handle negative indexes as well (they become > INT_MAX)
        // JBE $helper
        InsertCompareBranch(strLength, r2, Js::OpCode::BrLe_A, true, labelHelper, insertInstr);

#if TARGET_32
        if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
        {
            // Mask off the sign so that poisoning will work for negative indices
            InsertAnd(r2, r2, IR::IntConstOpnd::New(INT32_MAX, TyInt32, m_func), insertInstr);
        }
#endif

        if (r2->GetSize() != MachPtr)
        {
            r2 = r2->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        indexOpnd = r2;

        indirOpnd = IR::IndirOpnd::New(r1, r2, 1, TyUint16, this->m_func);
    }
    IR::RegOpnd* maskOpnd = nullptr;
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        maskOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
        if (strLength->GetSize() != MachPtr)
        {
            strLength = strLength->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        InsertSub(false, maskOpnd, indexOpnd, strLength, insertInstr);
        InsertShift(Js::OpCode::Shr_A, false, maskOpnd, maskOpnd, IR::IntConstOpnd::New(MachRegInt * 8 - 1, TyInt8, m_func), insertInstr);

        if (maskOpnd->GetSize() != TyUint32)
        {
            maskOpnd = maskOpnd->UseWithNewType(TyUint32, this->m_func)->AsRegOpnd();
        }
    }
    // MOVZX charReg, [r1 + r2 * 2]  -- this is the value of the char
    IR::RegOpnd *charReg = IR::RegOpnd::New(TyUint32, this->m_func);
    InsertMove(charReg, indirOpnd, insertInstr);
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        InsertAnd(charReg, charReg, maskOpnd, insertInstr);
    }
    if (index == Js::BuiltinFunction::JavascriptString_CharAt)
    {
        IR::Opnd *resultOpnd;
        if (dst->IsEqual(srcStr))
        {
            resultOpnd = IR::RegOpnd::New(TyVar, this->m_func);
        }
        else
        {
            resultOpnd = dst;
        }
        GenerateGetSingleCharString(charReg, resultOpnd, labelHelper, doneLabel, insertInstr, false);
    }
    else
    {
        Assert(index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt);

        if (index == Js::BuiltinFunction::JavascriptString_CodePointAt)
        {
            GenerateFastInlineStringCodePointAt(insertInstr, this->m_func, strLength, srcIndex, charReg, r1);
        }

        if (charReg->GetSize() != MachPtr)
        {
            charReg = charReg->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        m_lowererMD.GenerateInt32ToVarConversion(charReg, insertInstr);

        // MOV dst, charReg
        InsertMove(dst, charReg, insertInstr);
    }
    return true;
}